

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DropFaceNormalsProcess.cpp
# Opt level: O2

void __thiscall
Assimp::DropFaceNormalsProcess::Execute(DropFaceNormalsProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  DeadlyImportError *this_00;
  byte bVar3;
  uint a;
  ulong uVar4;
  allocator<char> local_41;
  string local_40;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"DropFaceNormalsProcess begin");
  if ((pScene->mFlags & 8) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,&local_41);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = 0;
  for (uVar4 = 0; uVar4 < pScene->mNumMeshes; uVar4 = uVar4 + 1) {
    bVar1 = DropMeshFaceNormals((DropFaceNormalsProcess *)pLVar2,pScene->mMeshes[uVar4]);
    bVar3 = bVar3 | bVar1;
  }
  pLVar2 = DefaultLogger::get();
  if (bVar3 != 0) {
    Logger::info(pLVar2,"DropFaceNormalsProcess finished. Face normals have been removed");
    return;
  }
  Logger::debug(pLVar2,"DropFaceNormalsProcess finished. No normals were present");
  return;
}

Assistant:

void DropFaceNormalsProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("DropFaceNormalsProcess begin");

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");
    }

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        bHas |= this->DropMeshFaceNormals( pScene->mMeshes[a]);
    }
    if (bHas)   {
        ASSIMP_LOG_INFO("DropFaceNormalsProcess finished. "
            "Face normals have been removed");
    } else {
        ASSIMP_LOG_DEBUG("DropFaceNormalsProcess finished. "
            "No normals were present");
    }
}